

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppUTestApprovals.h
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  TestRegistry *pTVar2;
  
  if (ApprovalTests::initializeApprovalTestsForCppUTest()::logPlugin == '\0') {
    iVar1 = __cxa_guard_acquire(&ApprovalTests::initializeApprovalTestsForCppUTest()::logPlugin);
    if (iVar1 != 0) {
      ApprovalTests::ApprovalTestsCppUTestPlugin::ApprovalTestsCppUTestPlugin
                ((ApprovalTestsCppUTestPlugin *)
                 ApprovalTests::initializeApprovalTestsForCppUTest()::logPlugin);
      __cxa_atexit(ApprovalTests::ApprovalTestsCppUTestPlugin::~ApprovalTestsCppUTestPlugin,
                   ApprovalTests::initializeApprovalTestsForCppUTest()::logPlugin,&__dso_handle);
      __cxa_guard_release(&ApprovalTests::initializeApprovalTestsForCppUTest()::logPlugin);
    }
  }
  pTVar2 = TestRegistry::getCurrentRegistry();
  (*pTVar2->_vptr_TestRegistry[0xc])
            (pTVar2,ApprovalTests::initializeApprovalTestsForCppUTest()::logPlugin);
  iVar1 = CommandLineTestRunner::RunAllTests(argc,argv);
  pTVar2 = TestRegistry::getCurrentRegistry();
  (*pTVar2->_vptr_TestRegistry[0xd])(pTVar2);
  return iVar1;
}

Assistant:

int main(int argc, char** argv)
{
    ApprovalTests::initializeApprovalTestsForCppUTest();

    int result = CommandLineTestRunner::RunAllTests(argc, argv);
    TestRegistry::getCurrentRegistry()->resetPlugins();
    return result;
}